

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

chunk_conflict * moria_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool quest;
  ushort uVar1;
  short sVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  room_profile profile;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined3 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  _Bool _Var17;
  int16_t iVar18;
  uint32_t uVar19;
  int iVar20;
  wchar_t wVar21;
  uint32_t uVar22;
  chunk *c;
  _Bool **pp_Var23;
  _Bool *p_Var24;
  room_profile *prVar25;
  cave_profile *pcVar26;
  char *pcVar27;
  dun_data *pdVar28;
  int iVar29;
  wchar_t wVar30;
  wchar_t wVar31;
  long lVar32;
  ulong uVar33;
  int local_4c;
  
  uVar19 = Rand_div(10);
  iVar29 = 0x5f;
  if (dun->quest == false) {
    iVar20 = uVar19 + (int)p->depth / 0x18 + 1;
    iVar29 = 0x46;
    if ((1 < iVar20) && (iVar29 = 0x4b, iVar20 != 2)) {
      iVar29 = 0x50;
      if ((3 < iVar20) && (iVar29 = 0x55, iVar20 != 4)) {
        iVar29 = (uint)(5 < iVar20) * 5 + 0x5a;
      }
    }
  }
  uVar1 = z_info->dungeon_hgt;
  uVar19 = Rand_div(10);
  wVar21 = (int)((uVar19 + iVar29) * (uint)uVar1) / 100;
  uVar1 = z_info->dungeon_wid;
  uVar19 = Rand_div(10);
  pdVar28 = dun;
  wVar30 = (int)((uVar19 + iVar29) * (uint)uVar1) / 100;
  if (wVar21 <= min_height) {
    wVar21 = min_height;
  }
  if ((int)(uint)z_info->dungeon_hgt <= wVar21) {
    wVar21 = (uint)z_info->dungeon_hgt;
  }
  if (wVar30 <= min_width) {
    wVar30 = min_width;
  }
  if ((int)(uint)z_info->dungeon_wid <= wVar30) {
    wVar30 = (uint)z_info->dungeon_wid;
  }
  pcVar26 = dun->profile;
  wVar3 = pcVar26->block_size;
  dun->block_hgt = wVar3;
  pdVar28->block_wid = wVar3;
  sVar2 = p->depth;
  _Var17 = pdVar28->persist;
  wVar3 = pcVar26->dun_unusual;
  wVar4 = pcVar26->n_room_profiles;
  c = (chunk *)cave_new(wVar21,wVar30);
  c->depth = (int)sVar2;
  uVar5 = (c->width * c->height) / 7;
  if ((player->opts).opt[0x18] == true) {
    msg("height=%d  width=%d  nfloors=%d",(ulong)(uint)c->height,(ulong)(uint)c->width,(ulong)uVar5)
    ;
  }
  fill_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x15',L'\0');
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',true
                );
  pdVar28 = dun;
  wVar21 = c->height / dun->block_hgt;
  dun->row_blocks = wVar21;
  pdVar28->col_blocks = c->width / pdVar28->block_wid;
  pp_Var23 = (_Bool **)mem_zalloc((long)wVar21 << 3);
  pdVar28 = dun;
  dun->room_map = pp_Var23;
  if (L'\0' < pdVar28->row_blocks) {
    lVar32 = 0;
    do {
      p_Var24 = (_Bool *)mem_zalloc((long)pdVar28->col_blocks);
      dun->room_map[lVar32] = p_Var24;
      lVar32 = lVar32 + 1;
      pdVar28 = dun;
    } while (lVar32 < dun->row_blocks);
  }
  pdVar28->pit_num = L'\0';
  pdVar28->cent_n = L'\0';
  reset_entrance_data((chunk_conflict *)c);
  if (_Var17 != false) {
    build_staircase_rooms((chunk_conflict *)c,"Moria Generation");
  }
  local_4c = 0;
LAB_0014a9dd:
  do {
    if (((int)uVar5 <= c->feat_count[1]) && (L'\x01' < dun->cent_n)) {
      if (L'\0' < dun->row_blocks) {
        lVar32 = 0;
        do {
          mem_free(dun->room_map[lVar32]);
          lVar32 = lVar32 + 1;
        } while (lVar32 < dun->row_blocks);
      }
      mem_free(dun->room_map);
      do_traditional_tunneling((chunk_conflict *)c);
      ensure_connectedness((chunk_conflict *)c,true);
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x15',L'\0',
                     true);
      goto LAB_0014ab86;
    }
    if (local_4c == 0x1f5) {
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      c = (chunk *)0x0;
LAB_0014ab86:
      if (c == (chunk *)0x0) {
        pcVar27 = "moria chunk could not be created";
      }
      else {
        wVar21 = L'\0';
        draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',
                       L'\0',true);
        pcVar26 = dun->profile;
        if (L'\0' < (pcVar26->str).mag) {
          do {
            build_streamer((chunk_conflict *)c,L'\x11',(pcVar26->str).mc);
            wVar21 = wVar21 + L'\x01';
            pcVar26 = dun->profile;
          } while (wVar21 < (pcVar26->str).mag);
        }
        pcVar26 = dun->profile;
        if (L'\0' < (pcVar26->str).qua) {
          wVar21 = L'\0';
          do {
            build_streamer((chunk_conflict *)c,L'\x12',(pcVar26->str).qc);
            wVar21 = wVar21 + L'\x01';
            pcVar26 = dun->profile;
          } while (wVar21 < (pcVar26->str).qua);
        }
        _Var17 = dun->persist;
        quest = dun->quest;
        wVar21 = rand_range(3,4);
        wVar30 = rand_range(1,2);
        handle_level_stairs((chunk_conflict *)c,_Var17,quest,wVar21,wVar30);
        wVar21 = c->depth;
        uVar19 = (uint)(L'\x05' < wVar21) * 8 + 2;
        if (0xffffffe4 < (uint)(wVar21 + L'\xffffffdf')) {
          uVar19 = wVar21 / 3;
        }
        uVar22 = Rand_div(uVar19);
        alloc_objects((chunk_conflict *)c,L'\x01',L'\0',uVar22 + L'\x01',c->depth,'\0');
        uVar22 = Rand_div(uVar19);
        alloc_objects((chunk_conflict *)c,L'\x01',L'\x01',(int)(uVar22 + 1) / 5,c->depth,'\0');
        _Var17 = new_player_spot((chunk_conflict *)c,p);
        if (_Var17) {
          uVar1 = z_info->level_monster_min;
          uVar22 = Rand_div(8);
          mon_restrict("Moria dwellers",c->depth,c->depth,true);
          if (0 < (int)((uint)uVar1 + uVar19 + uVar22 + 1)) {
            iVar29 = (uint)uVar1 + uVar19 + uVar22 + 2;
            do {
              pick_and_place_distant_monster(c,p->grid,L'\0',true,c->depth);
              iVar29 = iVar29 + -1;
            } while (1 < iVar29);
          }
          mon_restrict((char *)0x0,c->depth,c->depth,false);
          iVar18 = Rand_normal((uint)z_info->room_item_av,3);
          alloc_objects((chunk_conflict *)c,L'\x02',L'\x03',(int)iVar18,c->depth,'\x01');
          iVar18 = Rand_normal((uint)z_info->both_item_av,3);
          alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar18,c->depth,'\x01');
          iVar18 = Rand_normal((uint)z_info->both_gold_av,3);
          alloc_objects((chunk_conflict *)c,L'\x03',L'\x02',(int)iVar18,c->depth,'\x01');
          return (chunk_conflict *)c;
        }
        uncreate_artifacts((chunk_conflict *)c);
        wipe_mon_list(c,p);
        cave_free((chunk_conflict *)c);
        pcVar27 = "could not place player";
      }
      *p_error = pcVar27;
      return (chunk_conflict *)0x0;
    }
    local_4c = local_4c + 1;
    wVar21 = Rand_div(100);
    wVar31 = L'\0';
    wVar30 = L'\0';
    do {
      if (dun->profile->max_rarity <= wVar31) break;
      uVar19 = Rand_div(wVar3);
      wVar30 = wVar30 + (uint)((int)uVar19 < c->depth / 2 + 0x32);
      wVar31 = wVar31 + L'\x01';
    } while (wVar31 == wVar30);
    if (L'\0' < wVar4) {
      uVar33 = 0;
      do {
        while( true ) {
          prVar25 = dun->profile->room_profiles;
          if ((wVar30 < prVar25[uVar33].rarity) || (prVar25[uVar33].cutoff <= wVar21)) break;
          prVar25 = prVar25 + uVar33;
          uVar6 = prVar25->next;
          uVar7 = prVar25->name;
          uVar8 = prVar25->builder;
          uVar9 = prVar25->rating;
          uVar10 = prVar25->height;
          uVar11 = prVar25->width;
          uVar12 = prVar25->level;
          uVar13 = prVar25->pit;
          uVar14 = *(undefined3 *)&prVar25->field_0x29;
          uVar15 = prVar25->rarity;
          uVar16 = prVar25->cutoff;
          profile.cutoff = uVar16;
          profile.rarity = uVar15;
          profile._41_3_ = uVar14;
          profile.pit = (_Bool)uVar13;
          profile.level = uVar12;
          profile.width = uVar11;
          profile.height = uVar10;
          profile.rating = uVar9;
          profile.builder = (room_builder_conflict)uVar8;
          profile.name = (char *)uVar7;
          profile.next = (room_profile *)uVar6;
          profile._52_4_ = (int)((ulong)*(undefined8 *)&prVar25->cutoff >> 0x20);
          _Var17 = room_build(c,L'\0',L'\0',profile,true);
          wVar31 = (int)uVar33 + L'\x01';
          uVar33 = (ulong)(uint)wVar31;
          if ((_Var17) || (wVar4 <= wVar31)) goto LAB_0014a9dd;
        }
        wVar31 = (int)uVar33 + L'\x01';
        uVar33 = (ulong)(uint)wVar31;
      } while (wVar31 < wVar4);
    }
  } while( true );
}

Assistant:

struct chunk *moria_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	int size_percent, y_size, x_size;
	struct chunk *c;

	/* Scale the level */
	i = randint1(10) + p->depth / 24;
	if (dun->quest) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;
	y_size = z_info->dungeon_hgt * (size_percent - 5 + randint0(10)) / 100;
	x_size = z_info->dungeon_wid * (size_percent - 5 + randint0(10)) / 100;

	/* Enforce dimension limits */
	y_size = MIN(MAX(y_size, min_height), z_info->dungeon_hgt);
	x_size = MIN(MAX(x_size, min_width), z_info->dungeon_wid);

	/* Set the block height and width */
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;

	c = moria_chunk(p, p->depth, MIN(z_info->dungeon_hgt, y_size),
		MIN(z_info->dungeon_wid, x_size), dun->persist);
	if (!c) {
		*p_error = "moria chunk could not be created";
		return NULL;
	}

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(c, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(c, FEAT_QUARTZ, dun->profile->str.qc);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, dun->quest,
		rand_range(3, 4), rand_range(1, 2));

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Moria levels have a high proportion of cave dwellers. */
	mon_restrict("Moria dwellers", c->depth, c->depth, true);

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, c->depth, c->depth, false);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}